

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_26382a::BuildSystemImpl::configureFileSystem(BuildSystemImpl *this,int mode)

{
  DeviceAgnosticFileSystem *this_00;
  ChecksumOnlyFileSystem *this_01;
  unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_> local_38;
  unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_> local_30;
  unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_> newFS_1;
  unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_> local_20;
  unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_> newFS;
  int mode_local;
  BuildSystemImpl *this_local;
  
  newFS._M_t.
  super___uniq_ptr_impl<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
  ._M_t.
  super__Tuple_impl<0UL,_llbuild::basic::FileSystem_*,_std::default_delete<llbuild::basic::FileSystem>_>
  .super__Head_base<0UL,_llbuild::basic::FileSystem_*,_false>._M_head_impl._4_4_ = mode;
  if (mode == 1) {
    this_00 = (DeviceAgnosticFileSystem *)operator_new(0x10);
    std::unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>::
    unique_ptr(&newFS_1,&this->fileSystem);
    llbuild::basic::DeviceAgnosticFileSystem::DeviceAgnosticFileSystem(this_00,&newFS_1);
    std::unique_ptr<llbuild::basic::FileSystem,std::default_delete<llbuild::basic::FileSystem>>::
    unique_ptr<std::default_delete<llbuild::basic::FileSystem>,void>
              ((unique_ptr<llbuild::basic::FileSystem,std::default_delete<llbuild::basic::FileSystem>>
                *)&local_20,(pointer)this_00);
    std::unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>::
    ~unique_ptr(&newFS_1);
    std::unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>::
    swap(&this->fileSystem,&local_20);
    std::unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>::
    ~unique_ptr(&local_20);
  }
  else if (mode == 2) {
    this_01 = (ChecksumOnlyFileSystem *)operator_new(0x10);
    std::unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>::
    unique_ptr(&local_38,&this->fileSystem);
    llbuild::basic::ChecksumOnlyFileSystem::ChecksumOnlyFileSystem(this_01,&local_38);
    std::unique_ptr<llbuild::basic::FileSystem,std::default_delete<llbuild::basic::FileSystem>>::
    unique_ptr<std::default_delete<llbuild::basic::FileSystem>,void>
              ((unique_ptr<llbuild::basic::FileSystem,std::default_delete<llbuild::basic::FileSystem>>
                *)&local_30,(pointer)this_01);
    std::unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>::
    ~unique_ptr(&local_38);
    std::unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>::
    swap(&this->fileSystem,&local_30);
    std::unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>::
    ~unique_ptr(&local_30);
  }
  return;
}

Assistant:

void configureFileSystem(int mode) {
    if (mode == 1) {
      std::unique_ptr<basic::FileSystem> newFS(
          new DeviceAgnosticFileSystem(std::move(fileSystem)));
      fileSystem.swap(newFS);
    } else if (mode == 2) {
      std::unique_ptr<basic::FileSystem> newFS(
          new ChecksumOnlyFileSystem(std::move(fileSystem)));
      fileSystem.swap(newFS);
    }
  }